

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PairList.cpp
# Opt level: O2

void __thiscall
OpenMD::PairList::removePairs
          (PairList *this,set<int,_std::less<int>,_std::allocator<int>_> *set1,
          set<int,_std::less<int>,_std::allocator<int>_> *set2)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  
  for (p_Var2 = (set1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(set1->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    for (p_Var1 = (set2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var1 != &(set2->_M_t)._M_impl.super__Rb_tree_header;
        p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
      removePair(this,p_Var2[1]._M_color,p_Var1[1]._M_color);
    }
  }
  return;
}

Assistant:

void PairList::removePairs(std::set<int>& set1, std::set<int>& set2) {
    for (std::set<int>::iterator iter1 = set1.begin(); iter1 != set1.end();
         ++iter1) {
      for (std::set<int>::iterator iter2 = set2.begin(); iter2 != set2.end();
           ++iter2) {
        this->removePair(*iter1, *iter2);
      }
    }
  }